

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssim.c
# Opt level: O2

double SSIMGetClipped_C(uint8_t *src1,int stride1,uint8_t *src2,int stride2,int xo,int yo,int W,
                       int H)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  uint8_t *puVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  double dVar12;
  uint8_t *local_88;
  VP8DistoStats local_48;
  
  uVar10 = 3;
  if (3 < yo) {
    uVar10 = (ulong)(uint)yo;
  }
  iVar4 = (int)uVar10 + -3;
  iVar2 = H + -1;
  if (yo + 3 < H + -1) {
    iVar2 = yo + 3;
  }
  uVar7 = 3;
  if (3 < xo) {
    uVar7 = (ulong)(uint)xo;
  }
  iVar3 = W + -1;
  if (xo + 3 < W + -1) {
    iVar3 = xo + 3;
  }
  local_88 = src1 + iVar4 * stride1;
  puVar6 = src2 + iVar4 * stride2;
  local_48.yym = 0;
  local_48.xym = 0;
  local_48.xxm = 0;
  local_48.ym = 0;
  local_48.xm = 0;
  local_48.w = 0;
  for (lVar11 = uVar10 - 3; lVar11 <= iVar2; lVar11 = lVar11 + 1) {
    iVar4 = (int)uVar7 - xo;
    for (lVar5 = uVar7 - 3; lVar5 <= iVar3; lVar5 = lVar5 + 1) {
      iVar9 = kWeight[((int)lVar11 - yo) + 3] * kWeight[iVar4];
      iVar8 = iVar9 * (uint)local_88[lVar5];
      local_48.xxm = local_48.xxm + (uint)local_88[lVar5] * iVar8;
      bVar1 = puVar6[lVar5];
      local_48.xm = local_48.xm + iVar8;
      local_48.xym = local_48.xym + iVar8 * (uint)bVar1;
      local_48.w = local_48.w + iVar9;
      iVar9 = iVar9 * (uint)bVar1;
      local_48.ym = local_48.ym + iVar9;
      local_48.yym = local_48.yym + iVar9 * (uint)bVar1;
      iVar4 = iVar4 + 1;
    }
    local_88 = local_88 + stride1;
    puVar6 = puVar6 + stride2;
  }
  dVar12 = VP8SSIMFromStatsClipped(&local_48);
  return dVar12;
}

Assistant:

static double SSIMGetClipped_C(const uint8_t* src1, int stride1,
                               const uint8_t* src2, int stride2,
                               int xo, int yo, int W, int H) {
  VP8DistoStats stats = { 0, 0, 0, 0, 0, 0 };
  const int ymin = (yo - VP8_SSIM_KERNEL < 0) ? 0 : yo - VP8_SSIM_KERNEL;
  const int ymax = (yo + VP8_SSIM_KERNEL > H - 1) ? H - 1
                                                  : yo + VP8_SSIM_KERNEL;
  const int xmin = (xo - VP8_SSIM_KERNEL < 0) ? 0 : xo - VP8_SSIM_KERNEL;
  const int xmax = (xo + VP8_SSIM_KERNEL > W - 1) ? W - 1
                                                  : xo + VP8_SSIM_KERNEL;
  int x, y;
  src1 += ymin * stride1;
  src2 += ymin * stride2;
  for (y = ymin; y <= ymax; ++y, src1 += stride1, src2 += stride2) {
    for (x = xmin; x <= xmax; ++x) {
      const uint32_t w = kWeight[VP8_SSIM_KERNEL + x - xo]
                       * kWeight[VP8_SSIM_KERNEL + y - yo];
      const uint32_t s1 = src1[x];
      const uint32_t s2 = src2[x];
      stats.w   += w;
      stats.xm  += w * s1;
      stats.ym  += w * s2;
      stats.xxm += w * s1 * s1;
      stats.xym += w * s1 * s2;
      stats.yym += w * s2 * s2;
    }
  }
  return VP8SSIMFromStatsClipped(&stats);
}